

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_ref.cpp
# Opt level: O2

bool __thiscall duckdb::ColumnDataRef::Equals(ColumnDataRef *this,TableRef *other_p)

{
  bool bVar1;
  ColumnDataRef *pCVar2;
  ColumnDataCollection *pCVar3;
  reference this_00;
  reference rhs;
  const_reference l1;
  const_reference l2;
  type left;
  type right;
  idx_t i;
  ulong __n;
  vector<duckdb::LogicalType,_true> expected_types;
  vector<duckdb::LogicalType,_true> other_expected_types;
  string unused;
  
  bVar1 = TableRef::Equals(&this->super_TableRef,other_p);
  if (bVar1) {
    pCVar2 = TableRef::Cast<duckdb::ColumnDataRef>(other_p);
    pCVar3 = shared_ptr<duckdb::ColumnDataCollection,_true>::operator->(&this->collection);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&expected_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &(pCVar3->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    pCVar3 = shared_ptr<duckdb::ColumnDataCollection,_true>::operator->(&pCVar2->collection);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&other_expected_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &(pCVar3->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    if (((long)expected_types.
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)expected_types.
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start ==
         (long)other_expected_types.
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)other_expected_types.
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start) &&
       ((long)(this->expected_names).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->expected_names).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
        (long)(pCVar2->expected_names).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(pCVar2->expected_names).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)) {
      __n = 0;
      do {
        if ((ulong)(((long)expected_types.
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)expected_types.
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= __n) {
          unused._M_dataplus._M_p = (pointer)&unused.field_2;
          unused._M_string_length = 0;
          unused.field_2._M_local_buf[0] = '\0';
          left = shared_ptr<duckdb::ColumnDataCollection,_true>::operator*(&this->collection);
          right = shared_ptr<duckdb::ColumnDataCollection,_true>::operator*(&pCVar2->collection);
          bVar1 = ColumnDataCollection::ResultEquals(left,right,&unused,true);
          ::std::__cxx11::string::~string((string *)&unused);
          goto LAB_01346388;
        }
        this_00 = vector<duckdb::LogicalType,_true>::get<true>(&expected_types,__n);
        rhs = vector<duckdb::LogicalType,_true>::get<true>(&other_expected_types,__n);
        l1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(&this->expected_names,__n);
        l2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(&pCVar2->expected_names,__n);
        bVar1 = LogicalType::operator!=(this_00,rhs);
        if (bVar1) break;
        bVar1 = StringUtil::CIEquals((string *)l1,(string *)l2);
        __n = __n + 1;
      } while (bVar1);
    }
    bVar1 = false;
LAB_01346388:
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&other_expected_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&expected_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ColumnDataRef::Equals(const TableRef &other_p) const {
	if (!TableRef::Equals(other_p)) {
		return false;
	}
	auto &other = other_p.Cast<ColumnDataRef>();
	auto expected_types = collection->Types();
	auto other_expected_types = other.collection->Types();
	if (expected_types.size() != other_expected_types.size()) {
		return false;
	}
	if (expected_names.size() != other.expected_names.size()) {
		return false;
	}
	D_ASSERT(expected_types.size() == expected_names.size());
	for (idx_t i = 0; i < expected_types.size(); i++) {
		auto &this_type = expected_types[i];
		auto &other_type = other_expected_types[i];

		auto &this_name = expected_names[i];
		auto &other_name = other.expected_names[i];

		if (this_type != other_type) {
			return false;
		}
		if (!StringUtil::CIEquals(this_name, other_name)) {
			return false;
		}
	}
	string unused;
	if (!ColumnDataCollection::ResultEquals(*collection, *other.collection, unused, true)) {
		return false;
	}
	return true;
}